

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvation_energy_compute.cpp
# Opt level: O1

void __thiscall SolvationEnergyCompute::delete_clusters_from_device(SolvationEnergyCompute *this)

{
  return;
}

Assistant:

void SolvationEnergyCompute::delete_clusters_from_device() const
{
//    timers_.delete_clusters_from_device.start();

#ifdef OPENACC_ENABLED
    const double* q_ptr = mol_interp_charge_.data();
    std::size_t q_num   = mol_interp_charge_.size();
    
    const double* p_ptr    = elem_interp_potential_.data();
    const double* p_dx_ptr = elem_interp_potential_dx_.data();
    const double* p_dy_ptr = elem_interp_potential_dy_.data();
    const double* p_dz_ptr = elem_interp_potential_dz_.data();
    
    std::size_t p_num    = elem_interp_potential_.size();
    std::size_t p_dx_num = elem_interp_potential_dx_.size();
    std::size_t p_dy_num = elem_interp_potential_dy_.size();
    std::size_t p_dz_num = elem_interp_potential_dz_.size();

    const double* solv_eng_ptr = solv_eng_vec_.data();
    std::size_t solv_eng_num   = solv_eng_vec_.size();
    
    #pragma acc exit data delete(q_ptr[0:q_num], p_ptr[0:p_num], \
                                 p_dx_ptr[0:p_dx_num], p_dy_ptr[0:p_dy_num], p_dz_ptr[0:p_dz_num])
    #pragma acc exit data copyout(solv_eng_ptr[0:solv_eng_num])
#endif

//    timers_.delete_clusters_from_device.stop();
}